

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O3

void eltcalc::GetEventRates(void)

{
  int iVar1;
  FILE *pFVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  FILE *outFile;
  char *pcVar5;
  char *pcVar6;
  float extraout_XMM0_Da;
  float in_XMM1_Da;
  float fVar7;
  int date_opts;
  occurrence occ;
  char acStack_1088 [4104];
  float fStack_68;
  float fStack_64;
  undefined1 auStack_60 [16];
  uint local_24;
  occurrence_granular local_20;
  
  pFVar2 = fopen("input/event_rates.csv","r");
  if (pFVar2 != (FILE *)0x0) {
    GetEventRates((FILE *)pFVar2);
    return;
  }
  iVar1 = 0x106092;
  pFVar2 = fopen("input/occurrence.bin","rb");
  if (pFVar2 != (FILE *)0x0) {
    local_24 = 0;
    fread(&local_24,4,1,pFVar2);
    if (local_24 < 2) {
      GetEventRates<occurrence>((occurrence *)&local_20,(FILE *)pFVar2);
    }
    else {
      GetEventRates<occurrence_granular>(&local_20,(FILE *)pFVar2);
    }
    return;
  }
  GetEventRates();
  pcVar6 = "input/quantile.bin";
  pcVar5 = "rb";
  pFVar2 = fopen("input/quantile.bin","rb");
  if (pFVar2 != (FILE *)0x0) {
    sVar3 = fread(&fStack_68,4,1,pFVar2);
    if (sVar3 != 0) {
      fStack_64 = (float)(iVar1 + -1);
      do {
        fVar7 = fStack_68 * fStack_64 + 1.0;
        auStack_60 = ZEXT416((uint)(fVar7 - (float)(int)fVar7));
        pmVar4 = std::
                 map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                 ::operator[]((map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                               *)intervals_,&fStack_68);
        pmVar4->integer_part = (int)fVar7;
        pmVar4->fractional_part = (float)auStack_60._0_4_;
        sVar3 = fread(&fStack_68,4,1,pFVar2);
      } while (sVar3 != 0);
    }
    fclose(pFVar2);
    return;
  }
  GetIntervals();
  iVar1 = sprintf(acStack_1088,"%d,%d,%d,%f,%f,%f\n",(double)extraout_XMM0_Da,
                  SUB84((double)in_XMM1_Da,0),(double)*(float *)((long)pcVar6 + 8),
                  (ulong)*(uint *)((long)pcVar6 + 4),(ulong)pcVar5 & 0xffffffff,
                  (ulong)*(uint *)pcVar6);
  WriteOutput(acStack_1088,iVar1,outFile);
  return;
}

Assistant:

void GetEventRates()
	{
		// Extract event rates from event rates file if it exists
		FILE *fin = fopen(EVENTRATES_FILE, "r");
		if (fin != nullptr) {
			GetEventRates(fin);
			return;
		}

		// Otherwise calculate event rates from occurrence file
		fin = fopen(OCCURRENCE_FILE, "rb");
		if (fin == nullptr) {
			fprintf(stderr, "FATAL: %s: Error opening file %s\n",
				__func__, OCCURRENCE_FILE);
			exit(EXIT_FAILURE);
		}

		int date_opts = 0;
		fread(&date_opts, sizeof(date_opts), 1, fin);
		int granular_date = date_opts >> 1;
		if (granular_date) {
			occurrence_granular occ;
			GetEventRates(occ, fin);
		} else {
			occurrence occ;
			GetEventRates(occ, fin);
		}
	}